

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseImplicitTypeDefsCtx::makeTypeUse
          (Result<wasm::Ok> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *this,Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
          param_2,ParamsT *params,ResultsT *results)

{
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::HeapType>,_false,_false>,_bool>
  *__return_storage_ptr___00;
  Signature sig_00;
  bool bVar1;
  const_iterator pvVar2;
  reference pTVar3;
  type *this_00;
  pointer ppVar4;
  value_type *__x;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Signature,_wasm::HeapType>,_false,_true>,_bool>
  pVar5;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_258;
  Ok local_209;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::HeapType>,_false,_false>,_bool>
  *local_208;
  undefined1 local_1f8 [32];
  HeapType local_1d8;
  HeapType type;
  type_conflict1 *inserted;
  type *it;
  HeapType local_1b0;
  pair<const_wasm::Signature,_wasm::HeapType> local_1a8;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Signature,_wasm::HeapType>,_false,_true>,_bool>
  local_190;
  Type local_180;
  Type local_178;
  undefined1 auStack_170 [8];
  Signature sig;
  string local_158;
  Err local_138;
  Type local_118;
  Type t;
  const_iterator __end3;
  const_iterator __begin3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_d0;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_b8;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_a0;
  initializer_list<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *__range2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> resultTypes;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_60;
  undefined1 local_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> paramTypes;
  ResultsT *results_local;
  ParamsT *params_local;
  ParseImplicitTypeDefsCtx *pPStack_18;
  Index pos_local;
  ParseImplicitTypeDefsCtx *this_local;
  
  paramTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)results;
  params_local._4_4_ = pos;
  pPStack_18 = this;
  this_local = (ParseImplicitTypeDefsCtx *)__return_storage_ptr__;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
  if (params != (ParamsT *)0x0) {
    getUnnamedTypes(&local_60,params);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,&local_60);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_60);
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
  if (paramTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               paramTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_d0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_b8,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
  local_a0.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_d0;
  local_a0.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  local_a0.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_a0;
  __end2 = std::initializer_list<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::begin
                     ((initializer_list<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                      local_a0.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::initializer_list<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::end
                     ((initializer_list<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                      local_a0.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  do {
    if (__end2 == pvVar2) {
      v._4_4_ = 2;
LAB_0240d5e9:
      local_258 = &local_a0;
      do {
        local_258 = local_258 + -1;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(local_258);
      } while (local_258 != &local_d0);
      if (v._4_4_ == 2) {
        wasm::Type::Type(&local_178,(Tuple *)local_48);
        wasm::Type::Type(&local_180,(Tuple *)&__range2);
        Signature::Signature((Signature *)auStack_170,local_178,local_180);
        HeapType::HeapType(&local_1b0,func);
        std::pair<const_wasm::Signature,_wasm::HeapType>::
        pair<wasm::Signature_&,_wasm::HeapType,_true>
                  (&local_1a8,(Signature *)auStack_170,&local_1b0);
        pVar5 = std::
                unordered_map<wasm::Signature,_wasm::HeapType,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>_>
                ::insert(&this->sigTypes,&local_1a8);
        local_190.first =
             pVar5.first.
             super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>.
             _M_cur;
        local_190.second = pVar5.second;
        this_00 = std::
                  get<0ul,std::__detail::_Node_iterator<std::pair<wasm::Signature_const,wasm::HeapType>,false,true>,bool>
                            (&local_190);
        type.id = (uintptr_t)
                  std::
                  get<1ul,std::__detail::_Node_iterator<std::pair<wasm::Signature_const,wasm::HeapType>,false,true>,bool>
                            (&local_190);
        if ((*(type_conflict1 *)type.id & 1U) != 0) {
          local_1f8._16_8_ = auStack_170;
          local_1f8._24_8_ = sig.params.id;
          sig_00.results.id = sig.params.id;
          sig_00.params.id = (uintptr_t)auStack_170;
          HeapType::HeapType(&local_1d8,sig_00);
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_wasm::Signature,_wasm::HeapType>,_false,_true>::
                   operator->(this_00);
          (ppVar4->second).id = local_1d8.id;
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                    (this->types,&local_1d8);
        }
        __return_storage_ptr___00 =
             (pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::HeapType>,_false,_false>,_bool>
              *)this->implicitTypes;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::Signature,_wasm::HeapType>,_false,_true>::
                 operator->(this_00);
        std::pair<const_unsigned_int,_wasm::HeapType>::pair<unsigned_int_&,_wasm::HeapType_&,_true>
                  ((pair<const_unsigned_int,_wasm::HeapType> *)local_1f8,
                   (uint *)((long)&params_local + 4),&ppVar4->second);
        local_208 = std::
                    unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                    ::insert(__return_storage_ptr___00,
                             (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                              *)local_1f8,__x);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_209);
      }
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
      return __return_storage_ptr__;
    }
    __end3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(__end2);
    t.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(__end2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                       *)&t), bVar1) {
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end3);
      local_118.id = pTVar3->id;
      bVar1 = wasm::Type::isSingle(&local_118);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"tuple types not allowed in signature",
                   (allocator<char> *)((long)&sig.results.id + 7));
        Lexer::err(&local_138,&this->in,&local_158);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_138);
        wasm::Err::~Err(&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)((long)&sig.results.id + 7));
        v._4_4_ = 1;
        goto LAB_0240d5e9;
      }
      __gnu_cxx::
      __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
      operator++(&__end3);
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT>,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Type> paramTypes;
    if (params) {
      paramTypes = getUnnamedTypes(*params);
    }

    std::vector<Type> resultTypes;
    if (results) {
      resultTypes = *results;
    }

    for (auto& v : {paramTypes, resultTypes}) {
      for (auto t : v) {
        if (!t.isSingle()) {
          return in.err("tuple types not allowed in signature");
        }
      }
    }

    auto sig = Signature(Type(paramTypes), Type(resultTypes));
    auto [it, inserted] = sigTypes.insert({sig, HeapType(HeapType::func)});
    if (inserted) {
      auto type = HeapType(sig);
      it->second = type;
      types.push_back(type);
    }
    implicitTypes.insert({pos, it->second});

    return Ok{};
  }